

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O1

void use_smart_pointers(void)

{
  _Alloc_hider _Var1;
  Report *pRVar2;
  ostream *poVar3;
  auto_ptr<L16_1::Report> ps;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ps_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string local_80;
  string local_60;
  string local_40;
  
  pRVar2 = (Report *)operator_new(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"I\'m using auto pointer!","")
  ;
  L16_1::Report::Report(pRVar2,&local_40);
  local_b0._M_dataplus._M_p = (pointer)pRVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,*(char **)local_b0._M_dataplus._M_p,
                      *(size_type *)(local_b0._M_dataplus._M_p + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  _Var1._M_p = local_b0._M_dataplus._M_p;
  if ((Report *)local_b0._M_dataplus._M_p != (Report *)0x0) {
    L16_1::Report::~Report((Report *)local_b0._M_dataplus._M_p);
    operator_delete(_Var1._M_p);
  }
  pRVar2 = (Report *)operator_new(0x20);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"I\'m using shared pointer!","");
  L16_1::Report::Report(pRVar2,&local_60);
  local_b0._M_dataplus._M_p = (pointer)pRVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<L16_1::Report*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length,pRVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,*(char **)local_b0._M_dataplus._M_p,
                      *(size_type *)(local_b0._M_dataplus._M_p + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
  }
  pRVar2 = (Report *)operator_new(0x20);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"I\'m using unique pointer!","");
  L16_1::Report::Report(pRVar2,&local_80);
  local_b0._M_dataplus._M_p = (pointer)pRVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,*(char **)local_b0._M_dataplus._M_p,
                      *(size_type *)(local_b0._M_dataplus._M_p + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  _Var1._M_p = local_b0._M_dataplus._M_p;
  if ((Report *)local_b0._M_dataplus._M_p != (Report *)0x0) {
    L16_1::Report::~Report((Report *)local_b0._M_dataplus._M_p);
    operator_delete(_Var1._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Just curious about c++...","");
  local_90 = &local_b0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_88,&local_b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"s: ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void use_smart_pointers() {
    using namespace L16_1;
    using namespace std;

    {
        auto_ptr<Report> ps(new Report("I'm using auto pointer!"));
        //  ps is actually an object. it override operator->
        ps->comment();
    }

    {
        shared_ptr<Report> ps(new Report("I'm using shared pointer!"));
        ps->comment();
    }

    {
        unique_ptr<Report> ps(new Report("I'm using unique pointer!"));
        //  same as above...
        ps->comment();
    }

    {
        //  this is auto variable, it is on stack, NOT heap
        string s("Just curious about c++...");

        //  use address on heap, when destruct, will cause 'delete xxx', that is actually an error
        shared_ptr<string> ps(&s);

        cout << "s: " << s;
    }
}